

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

StatWriter * __thiscall OpenMD::Integrator::createStatWriter(Integrator *this)

{
  Stats *this_00;
  StatWriter *pSVar1;
  string sStack_38;
  
  this_00 = (Stats *)operator_new(0x68);
  Stats::Stats(this_00,this->info_);
  this->stats = this_00;
  pSVar1 = (StatWriter *)operator_new(0x448);
  std::__cxx11::string::string((string *)&sStack_38,(string *)&this->info_->statFileName_);
  StatWriter::StatWriter(pSVar1,&sStack_38,this->stats);
  this->statWriter = pSVar1;
  std::__cxx11::string::~string((string *)&sStack_38);
  pSVar1 = this->statWriter;
  std::__cxx11::string::string((string *)&sStack_38,(string *)&this->info_->reportFileName_);
  std::__cxx11::string::_M_assign((string *)&pSVar1->reportFileName_);
  std::__cxx11::string::~string((string *)&sStack_38);
  return this->statWriter;
}

Assistant:

StatWriter* Integrator::createStatWriter() {
    stats      = new Stats(info_);
    statWriter = new StatWriter(info_->getStatFileName(), stats);
    statWriter->setReportFileName(info_->getReportFileName());

    return statWriter;
  }